

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void Omega_h::fill_linear<double>(Write<double> *a,double offset,double stride)

{
  int *piVar1;
  Alloc *pAVar2;
  size_t sVar3;
  type_conflict2 f;
  type_conflict2 local_28;
  
  pAVar2 = (a->shared_alloc_).alloc;
  local_28.a.shared_alloc_.alloc = pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28.a.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_28.a.shared_alloc_.direct_ptr = (a->shared_alloc_).direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar3 = pAVar2->size;
  }
  else {
    sVar3 = (ulong)pAVar2 >> 3;
  }
  local_28.offset = offset;
  local_28.stride = stride;
  parallel_for<Omega_h::fill_linear<double>(Omega_h::Write<double>,double,double)::_lambda(int)_1_>
            ((LO)(sVar3 >> 3),&local_28,"Write(size,offset,stride)");
  pAVar2 = local_28.a.shared_alloc_.alloc;
  if (((ulong)local_28.a.shared_alloc_.alloc & 7) == 0 &&
      local_28.a.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_28.a.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28.a.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}